

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O3

pointer_type
cppcms::impl::
mfunc_to_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
          (offset_in_cgi_forwarder_to_subr f,
          shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *s)

{
  handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
  *this;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *in_RCX;
  shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *local_30 [2];
  
  local_30[0] = s;
  this = (handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
          *)operator_new(0x30);
  handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
  ::handler_binder_p0(this,(offset_in_cgi_forwarder_to_subr *)local_30,in_RCX);
  *(handler_binder_p0<void_(cppcms::impl::cgi::connection::cgi_forwarder::*)(),_std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_()> *)f;
}

Assistant:

booster::aio::handler::pointer_type mfunc_to_handler(void (C::*f)(),S s)
{
	return new handler_binder_p0<void (C::*)(),S>(f,s);
}